

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,_0,_int>::operator=
          (SparseMatrix<double,_0,_int> *this,SparseMatrix<double,_0,_int> *other)

{
  size_t __n;
  ActualDstType actualDst;
  
  if ((other->super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>).
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    swap(this,other);
  }
  else if (this != other) {
    SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)this,other);
    if (other->m_innerNonZeros == (StorageIndex *)0x0) {
      __n = this->m_outerSize * 4 + 4;
      if (__n != 0) {
        memcpy(this->m_outerIndex,other->m_outerIndex,__n);
      }
      internal::CompressedStorage<double,_int>::operator=(&this->m_data,&other->m_data);
    }
    else {
      internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (this,other);
    }
  }
  return this;
}

Assistant:

inline SparseMatrix& operator=(const SparseMatrix& other)
    {
      if (other.isRValue())
      {
        swap(other.const_cast_derived());
      }
      else if(this!=&other)
      {
        #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
          EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
        #endif
        initAssignment(other);
        if(other.isCompressed())
        {
          internal::smart_copy(other.m_outerIndex, other.m_outerIndex + m_outerSize + 1, m_outerIndex);
          m_data = other.m_data;
        }
        else
        {
          Base::operator=(other);
        }
      }
      return *this;
    }